

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

bool __thiscall
QGraphicsItemPrivate::discardUpdateRequest
          (QGraphicsItemPrivate *this,bool ignoreVisibleBit,bool ignoreDirtyBit,bool ignoreOpacity)

{
  long lVar1;
  QGraphicsItemPrivate *pQVar2;
  QGraphicsItem *pQVar3;
  long lVar4;
  ulong uVar5;
  qreal o;
  double dVar6;
  
  if ((this->scene != (QGraphicsScene *)0x0) &&
     (uVar5 = *(ulong *)&this->field_0x160, (uVar5 & 0x200000000000020) != 0 || ignoreVisibleBit)) {
    if (ignoreDirtyBit) {
      if (((byte)(uVar5 >> 0x3a) & 1) != 0 || ignoreOpacity) {
        return false;
      }
    }
    else {
      if ((int)uVar5 < 0 || ignoreOpacity) {
        return (bool)((byte)(uVar5 >> 0x1f) & 1);
      }
      if ((uVar5 >> 0x3a & 1) != 0) {
        return false;
      }
    }
    lVar1 = (this->children).d.size;
    if (lVar1 != 0) {
      if ((uVar5 >> 0x27 & 1) != 0) {
        return false;
      }
      lVar4 = 0;
      do {
        if (((((this->children).d.ptr[lVar4]->d_ptr).d)->field_0x164 & 0x40) != 0) {
          return false;
        }
        lVar4 = lVar4 + 1;
      } while (lVar1 != lVar4);
    }
    dVar6 = this->opacity;
    if (0.001 <= dVar6) {
      pQVar3 = this->parent;
      if (pQVar3 == (QGraphicsItem *)0x0) {
        return false;
      }
      uVar5 = uVar5 >> 0x20;
      do {
        pQVar2 = (pQVar3->d_ptr).d;
        if ((*(uint *)&pQVar2->field_0x164 & 0x80) != 0 || (uVar5 & 0x40) != 0) break;
        dVar6 = dVar6 * pQVar2->opacity;
        pQVar3 = pQVar2->parent;
        uVar5 = (ulong)*(uint *)&pQVar2->field_0x164;
      } while (pQVar3 != (QGraphicsItem *)0x0);
      return dVar6 < 0.001;
    }
  }
  return true;
}

Assistant:

bool QGraphicsItemPrivate::discardUpdateRequest(bool ignoreVisibleBit, bool ignoreDirtyBit,
                                                bool ignoreOpacity) const
{
    // No scene, or if the scene is updating everything, means we have nothing
    // to do. The only exception is if the scene tracks the growing scene rect.
    return !scene
           || (!visible && !ignoreVisibleBit && !this->ignoreVisible)
           || (!ignoreDirtyBit && fullUpdatePending)
           || (!ignoreOpacity && !this->ignoreOpacity && childrenCombineOpacity() && isFullyTransparent());
}